

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O2

void Amap_ManMatch(Amap_Man_t *p,int fFlow,int fRefs)

{
  Aig_MmFlex_t *p_00;
  uint uVar1;
  abctime aVar2;
  Aig_MmFlex_t *pAVar3;
  Amap_Obj_t *pNode;
  abctime aVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  aVar2 = Abc_Clock();
  p_00 = p->pMemCutBest;
  pAVar3 = Aig_MmFlexStart();
  p->pMemCutBest = pAVar3;
  for (iVar5 = 0; iVar5 < p->vObjs->nSize; iVar5 = iVar5 + 1) {
    pNode = (Amap_Obj_t *)Vec_PtrEntry(p->vObjs,iVar5);
    if (((pNode != (Amap_Obj_t *)0x0) &&
        (((undefined1  [96])*pNode & (undefined1  [96])0x6) == (undefined1  [96])0x4 ||
         ((undefined1  [96])*pNode & (undefined1  [96])0x7) == (undefined1  [96])0x6)) &&
       ((pNode->field_11).pData != (void *)0x0)) {
      Amap_ManMatchNode(p,pNode,fFlow,fRefs);
    }
  }
  Aig_MmFlexStop(p_00,0);
  fVar6 = Amap_ManComputeMapping(p);
  uVar1 = Amap_ManCountInverters(p);
  if (p->pPars->fVerbose != 0) {
    fVar7 = (float)(int)uVar1 * p->fAreaInv;
    fVar8 = Amap_ManMaxDelay(p);
    iVar5 = 0x7eaee8;
    printf("Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ",(double)(fVar7 + fVar6),
           (double)fVar6,(double)fVar7,(double)fVar8,(ulong)uVar1);
    Abc_Print(iVar5,"%s =","Time ");
    aVar4 = Abc_Clock();
    Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar4 - aVar2) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Amap_ManMatch( Amap_Man_t * p, int fFlow, int fRefs )
{
    Aig_MmFlex_t * pMemOld;
    Amap_Obj_t * pObj;
    float Area;
    int i, nInvs;
    abctime clk = Abc_Clock();
    pMemOld = p->pMemCutBest;
    p->pMemCutBest = Aig_MmFlexStart();
    Amap_ManForEachNode( p, pObj, i )
        if ( pObj->pData )
            Amap_ManMatchNode( p, pObj, fFlow, fRefs );
    Aig_MmFlexStop( pMemOld, 0 );
    Area = Amap_ManComputeMapping( p );
    nInvs = Amap_ManCountInverters( p );
if ( p->pPars->fVerbose )
{
    printf( "Area =%9.2f. Gate =%9.2f. Inv =%9.2f. (%6d.) Delay =%6.2f. ", 
        Area + nInvs * p->fAreaInv, 
        Area, nInvs * p->fAreaInv, nInvs,
        Amap_ManMaxDelay(p) );
ABC_PRT( "Time ", Abc_Clock() - clk );
}
    // test procedures
//    Amap_ManForEachNode( p, pObj, i )
//        Amap_CutAreaTest( p, pObj );
}